

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O0

void __thiscall
btVector3::getSkewSymmetricMatrix(btVector3 *this,btVector3 *v0,btVector3 *v1,btVector3 *v2)

{
  btScalar *pbVar1;
  btScalar *pbVar2;
  btVector3 *in_RCX;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28;
  btScalar local_24;
  btVector3 *local_20;
  btVector3 *local_18;
  
  local_24 = 0.0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  pbVar1 = z(in_RDI);
  local_28 = -*pbVar1;
  pbVar1 = y(in_RDI);
  setValue(in_RSI,&local_24,&local_28,pbVar1);
  pbVar1 = z(in_RDI);
  local_2c = 0.0;
  pbVar2 = x(in_RDI);
  local_30 = -*pbVar2;
  setValue(local_18,pbVar1,&local_2c,&local_30);
  pbVar1 = y(in_RDI);
  local_34 = -*pbVar1;
  pbVar1 = x(in_RDI);
  local_38 = 0.0;
  setValue(local_20,&local_34,pbVar1,&local_38);
  return;
}

Assistant:

void	getSkewSymmetricMatrix(btVector3* v0,btVector3* v1,btVector3* v2) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)

		__m128 V  = _mm_and_ps(mVec128, btvFFF0fMask);
		__m128 V0 = _mm_xor_ps(btvMzeroMask, V);
		__m128 V2 = _mm_movelh_ps(V0, V);

		__m128 V1 = _mm_shuffle_ps(V, V0, 0xCE);

        V0 = _mm_shuffle_ps(V0, V, 0xDB);
		V2 = _mm_shuffle_ps(V2, V, 0xF9);

		v0->mVec128 = V0;
		v1->mVec128 = V1;
		v2->mVec128 = V2;
#else
		v0->setValue(0.		,-z()		,y());
		v1->setValue(z()	,0.			,-x());
		v2->setValue(-y()	,x()	,0.);
#endif
	}